

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O0

void __thiscall soul::heart::Parser::parseInput(Parser *this,InputDeclaration *inputDeclaration)

{
  bool bVar1;
  EndpointType EVar2;
  vector<soul::Type,_std::allocator<soul::Type>_> local_58;
  char *local_40;
  uint32_t local_34;
  _Optional_payload_base<unsigned_int> local_30;
  char *local_28;
  string *local_20;
  IODeclaration *local_18;
  InputDeclaration *inputDeclaration_local;
  Parser *this_local;
  
  local_18 = &inputDeclaration->super_IODeclaration;
  inputDeclaration_local = (InputDeclaration *)this;
  local_20 = (string *)parseGeneralIdentifier(this);
  (local_18->name).name = local_20;
  local_28 = "[";
  bVar1 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x575e01);
  if (bVar1) {
    local_34 = parseProcessorArraySize(this);
    std::optional<unsigned_int>::optional<unsigned_int,_true>
              ((optional<unsigned_int> *)&local_30,&local_34);
    (local_18->arraySize).super__Optional_base<unsigned_int,_true,_true>._M_payload.
    super__Optional_payload_base<unsigned_int> = local_30;
    local_40 = "]";
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x54ace4);
  }
  EVar2 = parseEndpointType<soul::heart::Parser>(this);
  local_18->endpointType = EVar2;
  readEventTypeList(&local_58,this);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::operator=(&local_18->dataTypes,&local_58);
  std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_58);
  IODeclaration::checkDataTypesValid<soul::CodeLocation&>
            (local_18,&(this->
                       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ).location);
  parseAnnotation(this,&local_18->annotation);
  expectSemicolon(this);
  return;
}

Assistant:

void parseInput (heart::InputDeclaration& inputDeclaration)
    {
        inputDeclaration.name = parseGeneralIdentifier();

        if (matchIf (HEARTOperator::openBracket))
        {
            inputDeclaration.arraySize = parseProcessorArraySize();
            expect (HEARTOperator::closeBracket);
        }

        inputDeclaration.endpointType = parseEndpointType (*this);
        inputDeclaration.dataTypes = readEventTypeList();

        inputDeclaration.checkDataTypesValid (location);
        parseAnnotation (inputDeclaration.annotation);
        expectSemicolon();
    }